

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O2

ExtPrivkey * __thiscall
cfd::core::ExtPrivkey::DerivePrivkey
          (ExtPrivkey *__return_storage_ptr__,ExtPrivkey *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *path)

{
  pointer puVar1;
  CfdException *pCVar2;
  int ret;
  ByteData256 tweak_sum_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_1f0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tweak_sum;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_1c0;
  ext_key extkey;
  ext_key child_key;
  
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1c0,
                     &this->serialize_data_);
  ret = bip32_key_unserialize
                  (local_1c0._M_impl.super__Vector_impl_data._M_start,
                   (long)local_1c0._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_1c0._M_impl.super__Vector_impl_data._M_start,&extkey);
  if (ret != 0) {
    tweak_sum_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "cfdcore_hdwallet.cpp";
    tweak_sum_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0x274;
    tweak_sum_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = "DerivePrivkey";
    logger::warn<int&>((CfdSourceLocation *)&tweak_sum_data,"bip32_key_unserialize error. ret={}",
                       &ret);
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)&tweak_sum_data,"ExtPrivkey unserialize error.",(allocator *)&data);
    CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)&tweak_sum_data);
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ByteData256::GetBytes(&tweak_sum_data.data_,&this->tweak_sum_);
  extkey.pub_key_tweak_sum._0_8_ =
       *(undefined8 *)
        tweak_sum_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start;
  extkey.pub_key_tweak_sum._8_8_ =
       *(undefined8 *)
        (tweak_sum_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_start + 8);
  extkey.pub_key_tweak_sum._16_8_ =
       *(undefined8 *)
        (tweak_sum_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_start + 0x10);
  extkey.pub_key_tweak_sum._24_8_ =
       *(undefined8 *)
        (tweak_sum_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_start + 0x18);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tweak_sum_data);
  puVar1 = (path->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  ret = bip32_key_from_parent_path
                  (&extkey,puVar1,
                   (long)(path->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 2,4,&child_key)
  ;
  if (ret == 0) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&data,0x4e,
               (allocator_type *)&tweak_sum_data);
    ret = bip32_key_serialize(&child_key,0,
                              data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)data.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)data.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
    if (ret == 0) {
      ByteData256::ByteData256(&tweak_sum_data);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&tweak_sum,0x20,
                 (allocator_type *)&local_1f0);
      memcpy(tweak_sum.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,extkey.pub_key_tweak_sum,
             (long)tweak_sum.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)tweak_sum.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start);
      ByteData256::ByteData256((ByteData256 *)&local_1f0,&tweak_sum);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&tweak_sum_data,&local_1f0
                );
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_1f0);
      ByteData::ByteData((ByteData *)&local_1f0,&data);
      ExtPrivkey(__return_storage_ptr__,(ByteData *)&local_1f0,&tweak_sum_data);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_1f0);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&tweak_sum.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tweak_sum_data);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_1c0);
      return __return_storage_ptr__;
    }
    tweak_sum_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "cfdcore_hdwallet.cpp";
    tweak_sum_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0x28c;
    tweak_sum_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = "DerivePrivkey";
    logger::warn<int&>((CfdSourceLocation *)&tweak_sum_data,"bip32_key_serialize error. ret={}",&ret
                      );
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)&tweak_sum_data,"ExtPrivkey serialize error.",(allocator *)&tweak_sum);
    CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)&tweak_sum_data);
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  tweak_sum_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "cfdcore_hdwallet.cpp";
  tweak_sum_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0x284;
  tweak_sum_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = "DerivePrivkey";
  logger::warn<int&>((CfdSourceLocation *)&tweak_sum_data,"bip32_key_from_parent_path error. ret={}"
                     ,&ret);
  pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string
            ((string *)&tweak_sum_data,"ExtPrivkey derive error.",(allocator *)&data);
  CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)&tweak_sum_data);
  __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ExtPrivkey ExtPrivkey::DerivePrivkey(const std::vector<uint32_t>& path) const {
  struct ext_key extkey;
  struct ext_key child_key;

  const std::vector<uint8_t>& serialize_data = serialize_data_.GetBytes();
  int ret = bip32_key_unserialize(
      serialize_data.data(), serialize_data.size(), &extkey);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "bip32_key_unserialize error. ret={}", ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "ExtPrivkey unserialize error.");
  }

#ifndef CFD_DISABLE_ELEMENTS
  // write pub_key_tweak_sum to ext_key
  memcpy(
      extkey.pub_key_tweak_sum, tweak_sum_.GetBytes().data(),
      sizeof(extkey.pub_key_tweak_sum));
#endif  // CFD_DISABLE_ELEMENTS
  uint32_t flag = BIP32_FLAG_KEY_PRIVATE;
  ret = bip32_key_from_parent_path(
      &extkey, path.data(), path.size(), flag | BIP32_FLAG_KEY_TWEAK_SUM,
      &child_key);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "bip32_key_from_parent_path error. ret={}", ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "ExtPrivkey derive error.");
  }

  std::vector<uint8_t> data(BIP32_SERIALIZED_LEN);
  ret = bip32_key_serialize(&child_key, flag, data.data(), data.size());
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "bip32_key_serialize error. ret={}", ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "ExtPrivkey serialize error.");
  }

  ByteData256 tweak_sum_data;
#ifndef CFD_DISABLE_ELEMENTS
  // collect pub_key_tweak_sum from ext_key
  std::vector<uint8_t> tweak_sum(sizeof(extkey.pub_key_tweak_sum));
  memcpy(tweak_sum.data(), extkey.pub_key_tweak_sum, tweak_sum.size());
  tweak_sum_data = ByteData256(tweak_sum);
#endif  // CFD_DISABLE_ELEMENTS
  return ExtPrivkey(ByteData(data), tweak_sum_data);
}